

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVector.h
# Opt level: O0

void __thiscall
JointPolicyPureVector::JointPolicyPureVector(JointPolicyPureVector *this,I_PtPDpure_constPtr *pu)

{
  PolicyDomainCategory PVar1;
  type pIVar2;
  shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *in_RSI;
  JointPolicyDiscretePure *in_RDI;
  
  pIVar2 = boost::shared_ptr<const_Interface_ProblemToPolicyDiscretePure>::operator->(in_RSI);
  PVar1 = (**(code **)(*(long *)pIVar2 + 0x40))();
  JointPolicyDiscretePure::JointPolicyDiscretePure(in_RDI,(shared_ptr *)in_RSI,PVar1);
  pIVar2 = boost::shared_ptr<const_Interface_ProblemToPolicyDiscretePure>::operator->(in_RSI);
  PVar1 = (**(code **)(*(long *)pIVar2 + 0x40))();
  JPolComponent_VectorImplementation::JPolComponent_VectorImplementation
            ((JPolComponent_VectorImplementation *)(in_RDI + 0x38),(shared_ptr *)in_RSI,PVar1,999999
            );
  *(undefined **)in_RDI = &JointPolicyDiscretePure::typeinfo;
  *(code **)(in_RDI + 0x38) = __libc_start_main;
  std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::vector
            ((vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *)0x12b1a9);
  return;
}

Assistant:

JointPolicyPureVector(I_PtPDpure_constPtr pu)
          :
          JointPolicyDiscretePure( pu , pu->GetDefaultIndexDomCat()  ),
          JPolComponent_VectorImplementation(pu,  pu->GetDefaultIndexDomCat() )
        {}